

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption_NamePart::UninterpretedOption_NamePart
          (UninterpretedOption_NamePart *this,Arena *arena)

{
  Arena *in_RSI;
  UninterpretedOption_NamePart *in_RDI;
  Arena *in_stack_ffffffffffffffb8;
  
  Message::Message(&in_RDI->super_Message);
  ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    *)&in_RDI->super_Message)->ptr_ = &PTR__UninterpretedOption_NamePart_00967ff0;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)in_RDI,in_stack_ffffffffffffffb8);
  memset(&in_RDI->_has_bits_,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x52f318);
  SharedCtor(in_RDI);
  RegisterArenaDtor(in_RDI,in_RSI);
  return;
}

Assistant:

UninterpretedOption_NamePart::UninterpretedOption_NamePart(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
  _internal_metadata_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:google.protobuf.UninterpretedOption.NamePart)
}